

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  cJSON_bool cVar7;
  ulong uVar8;
  cJSON *item_00;
  long lVar9;
  cJSON *item_01;
  byte bVar10;
  uint uVar11;
  cJSON *pcVar12;
  cJSON *pcVar13;
  long in_FS_OFFSET;
  double dVar14;
  uchar *after_end;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar7 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar2 = input_buffer->content, puVar2 != (uchar *)0x0)) {
    uVar3 = input_buffer->length;
    uVar4 = input_buffer->offset;
    uVar8 = uVar4 + 4;
    if ((uVar3 < uVar8) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"null",4), iVar6 != 0)) {
      if ((uVar3 < uVar4 + 5) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"false",5), iVar6 != 0))
      {
        if ((uVar3 < uVar8) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"true",4), iVar6 != 0)) {
          if (uVar4 < uVar3) {
            uVar1 = puVar2[uVar4];
            if (uVar1 == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar7 = parse_string(item,input_buffer);
                return cVar7;
              }
              goto LAB_00103a32;
            }
            if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
              after_end = (uchar *)0x0;
              bVar5 = get_decimal_point();
              puVar2 = input_buffer->content;
              if (puVar2 != (uchar *)0x0) {
                for (lVar9 = 0;
                    (lVar9 != 0x3f && (lVar9 + input_buffer->offset < input_buffer->length));
                    lVar9 = lVar9 + 1) {
                  bVar10 = puVar2[lVar9 + input_buffer->offset];
                  uVar11 = bVar10 - 0x2b;
                  if ((0x3a < uVar11) ||
                     (((0x400000004007fe5U >> ((ulong)uVar11 & 0x3f) & 1) == 0 &&
                      (bVar10 = bVar5, (ulong)uVar11 != 3)))) break;
                  local_78[lVar9] = bVar10;
                }
                local_78[lVar9] = 0;
                dVar14 = strtod((char *)local_78,(char **)&after_end);
                if (local_78 != after_end) {
                  item->valuedouble = dVar14;
                  iVar6 = 0x7fffffff;
                  if ((dVar14 < 2147483647.0) && (iVar6 = -0x80000000, -2147483648.0 < dVar14)) {
                    iVar6 = (int)dVar14;
                  }
                  item->valueint = iVar6;
                  item->type = 8;
                  input_buffer->offset =
                       (size_t)(after_end + (input_buffer->offset - (long)local_78));
                  goto LAB_00103834;
                }
              }
            }
            else {
              if (uVar1 == '{') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  cVar7 = parse_object(item,input_buffer);
                  return cVar7;
                }
                goto LAB_00103a32;
              }
              if (((uVar1 == '[') && (input_buffer->depth < 1000)) &&
                 (input_buffer->depth = input_buffer->depth + 1, puVar2[uVar4] == '[')) {
                input_buffer->offset = uVar4 + 1;
                buffer_skip_whitespace(input_buffer);
                uVar8 = input_buffer->offset;
                if (uVar8 < input_buffer->length) {
                  if (input_buffer->content[uVar8] == ']') {
                    item_01 = (cJSON *)0x0;
                    item_00 = (cJSON *)0x0;
                  }
                  else {
                    input_buffer->offset = uVar8 - 1;
                    pcVar12 = (cJSON *)0x0;
                    pcVar13 = (cJSON *)0x0;
                    do {
                      item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                      if (item_00 == (cJSON *)0x0) {
                        item_01 = pcVar12;
                        if (pcVar12 == (cJSON *)0x0) goto LAB_00103a0a;
                        goto LAB_00103a02;
                      }
                      item_00->valuedouble = 0.0;
                      item_00->string = (char *)0x0;
                      item_00->valuestring = (char *)0x0;
                      *(undefined8 *)&item_00->valueint = 0;
                      item_00->child = (cJSON *)0x0;
                      *(undefined8 *)&item_00->type = 0;
                      item_00->next = (cJSON *)0x0;
                      item_00->prev = (cJSON *)0x0;
                      item_01 = item_00;
                      if (pcVar12 != (cJSON *)0x0) {
                        pcVar13->next = item_00;
                        item_00->prev = pcVar13;
                        item_01 = pcVar12;
                      }
                      input_buffer->offset = input_buffer->offset + 1;
                      buffer_skip_whitespace(input_buffer);
                      cVar7 = parse_value(item_00,input_buffer);
                      if (cVar7 == 0) goto LAB_00103a02;
                      buffer_skip_whitespace(input_buffer);
                      uVar8 = input_buffer->offset;
                      if (input_buffer->length <= uVar8) goto LAB_00103a02;
                      pcVar12 = item_01;
                      pcVar13 = item_00;
                    } while (input_buffer->content[uVar8] == ',');
                    if (input_buffer->content[uVar8] != ']') {
LAB_00103a02:
                      cJSON_Delete(item_01);
                      goto LAB_00103a0a;
                    }
                  }
                  input_buffer->depth = input_buffer->depth - 1;
                  if (item_01 != (cJSON *)0x0) {
                    item_01->prev = item_00;
                  }
                  item->type = 0x20;
                  item->child = item_01;
                  input_buffer->offset = uVar8 + 1;
                  goto LAB_00103834;
                }
                input_buffer->offset = uVar8 - 1;
              }
            }
          }
LAB_00103a0a:
          cVar7 = 0;
          goto LAB_00103a0c;
        }
        item->type = 2;
        item->valueint = 1;
        goto LAB_00103830;
      }
      item->type = 1;
      input_buffer->offset = uVar4 + 5;
    }
    else {
      item->type = 4;
LAB_00103830:
      input_buffer->offset = uVar8;
    }
LAB_00103834:
    cVar7 = 1;
  }
LAB_00103a0c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar7;
  }
LAB_00103a32:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}